

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvc.cpp
# Opt level: O0

bool __thiscall VvcUnit::dpb_parameters(VvcUnit *this,int MaxSubLayersMinus1,bool subLayerInfoFlag)

{
  uint uVar1;
  uint uVar2;
  uint local_3c;
  uint dpb_max_latency_increase_plus1;
  uint dpb_max_num_reorder_pics;
  uint dpb_max_dec_pic_buffering_minus1;
  int i;
  bool subLayerInfoFlag_local;
  int MaxSubLayersMinus1_local;
  VvcUnit *this_local;
  
  local_3c = MaxSubLayersMinus1;
  if (subLayerInfoFlag) {
    local_3c = 0;
  }
  dpb_max_num_reorder_pics = local_3c;
  while( true ) {
    if (MaxSubLayersMinus1 < (int)dpb_max_num_reorder_pics) {
      return false;
    }
    uVar1 = extractUEGolombCode(this);
    uVar2 = extractUEGolombCode(this);
    if (uVar1 < uVar2) break;
    uVar1 = extractUEGolombCode(this);
    if (uVar1 == 0xffffffff) {
      return true;
    }
    dpb_max_num_reorder_pics = dpb_max_num_reorder_pics + 1;
  }
  return true;
}

Assistant:

bool VvcUnit::dpb_parameters(const int MaxSubLayersMinus1, const bool subLayerInfoFlag)
{
    for (int i = (subLayerInfoFlag ? 0 : MaxSubLayersMinus1); i <= MaxSubLayersMinus1; i++)
    {
        const unsigned dpb_max_dec_pic_buffering_minus1 = extractUEGolombCode();
        const unsigned dpb_max_num_reorder_pics = extractUEGolombCode();
        if (dpb_max_num_reorder_pics > dpb_max_dec_pic_buffering_minus1)
            return true;
        const unsigned dpb_max_latency_increase_plus1 = extractUEGolombCode();
        if (dpb_max_latency_increase_plus1 == UINT_MAX)
            return true;
    }
    return false;
}